

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

_Bool ssh_ecdhkex_w_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  uint uVar1;
  mp_int *local_50;
  mp_int *x;
  WeierstrassPoint *p;
  WeierstrassPoint *remote_p;
  ecdh_key_w *dhw;
  BinarySink *bs_local;
  ecdh_key *dh_local;
  ptrlen remoteKey_local;
  
  remoteKey_local.ptr = (void *)remoteKey.len;
  dh_local = (ecdh_key *)remoteKey.ptr;
  remote_p = (WeierstrassPoint *)(dh + -4);
  dhw = (ecdh_key_w *)bs;
  bs_local = (BinarySink *)dh;
  p = ecdsa_decode(remoteKey,(ec_curve *)dh[-3].vt);
  if (p == (WeierstrassPoint *)0x0) {
    remoteKey_local.len._7_1_ = false;
  }
  else {
    uVar1 = ecc_weierstrass_is_identity(p);
    if (uVar1 == 0) {
      x = (mp_int *)ecc_weierstrass_multiply(p,remote_p->Z);
      ecc_weierstrass_get_affine((WeierstrassPoint *)x,&local_50,(mp_int **)0x0);
      BinarySink_put_mp_ssh2((BinarySink *)dhw->private,local_50);
      mp_free(local_50);
      ecc_weierstrass_point_free(p);
      ecc_weierstrass_point_free((WeierstrassPoint *)x);
      remoteKey_local.len._7_1_ = true;
    }
    else {
      ecc_weierstrass_point_free(p);
      remoteKey_local.len._7_1_ = false;
    }
  }
  return remoteKey_local.len._7_1_;
}

Assistant:

static bool ssh_ecdhkex_w_getkey(ecdh_key *dh, ptrlen remoteKey,
                                 BinarySink *bs)
{
    ecdh_key_w *dhw = container_of(dh, ecdh_key_w, ek);

    WeierstrassPoint *remote_p = ecdsa_decode(remoteKey, dhw->curve);
    if (!remote_p)
        return false;

    if (ecc_weierstrass_is_identity(remote_p)) {
        /* Not a sensible Diffie-Hellman input value */
        ecc_weierstrass_point_free(remote_p);
        return false;
    }

    WeierstrassPoint *p = ecc_weierstrass_multiply(remote_p, dhw->private);

    mp_int *x;
    ecc_weierstrass_get_affine(p, &x, NULL);
    put_mp_ssh2(bs, x);
    mp_free(x);

    ecc_weierstrass_point_free(remote_p);
    ecc_weierstrass_point_free(p);

    return true;
}